

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

bool __thiscall
Kernel::ScanAndApplyFormulaUnitTransformer::apply
          (ScanAndApplyFormulaUnitTransformer *this,UnitList **units)

{
  bool bVar1;
  Unit *this_00;
  List<Kernel::Unit_*> *lst;
  List<Kernel::Unit_*> **in_RSI;
  DelIterator *in_RDI;
  UnitList *added;
  Unit *newUnit;
  Unit *u;
  DelIterator uit;
  bool modified;
  Unit *in_stack_ffffffffffffffa8;
  Unit **in_stack_ffffffffffffffb8;
  Unit *in_stack_ffffffffffffffc0;
  DelIterator local_30;
  byte local_11;
  List<Kernel::Unit_*> **local_10;
  
  local_10 = in_RSI;
  (*(code *)in_RDI->_lst[2])(in_RDI,*in_RSI);
  local_11 = 0;
  Lib::List<Kernel::Unit_*>::DelIterator::DelIterator(&local_30,local_10);
  while (bVar1 = Lib::List<Kernel::Unit_*>::DelIterator::hasNext
                           ((DelIterator *)in_stack_ffffffffffffffa8), bVar1) {
    this_00 = Lib::List<Kernel::Unit_*>::DelIterator::next(in_RDI);
    bVar1 = apply((ScanAndApplyFormulaUnitTransformer *)this_00,in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffb8);
    if (bVar1) {
      if (in_stack_ffffffffffffffc0 == (Unit *)0x0) {
        Lib::List<Kernel::Unit_*>::DelIterator::del((DelIterator *)0x0);
      }
      else {
        Lib::List<Kernel::Unit_*>::DelIterator::replace(in_RDI,in_stack_ffffffffffffffa8);
      }
      local_11 = 1;
    }
  }
  lst = (List<Kernel::Unit_*> *)(*(code *)in_RDI->_lst[3])();
  if (lst != (List<Kernel::Unit_*> *)0x0) {
    local_11 = 1;
    Lib::List<Kernel::Unit_*>::DelIterator::insert((DelIterator *)in_stack_ffffffffffffffc0,lst);
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool ScanAndApplyFormulaUnitTransformer::apply(UnitList*& units)
{
  scan(units);

  bool modified = false;

  UnitList::DelIterator uit(units);
  while(uit.hasNext()) {
    Unit* u = uit.next();
    Unit* newUnit;

    if(!apply(u, newUnit)) {
      continue;
    }
    if(newUnit==0) {
      uit.del();
    }
    else {
      uit.replace(newUnit);
    }
    modified = true;
  }

  UnitList* added = getIntroducedFormulas();
  if(added) {
    modified = true;
    uit.insert(added);
  }

  return modified;
}